

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock_setup.cpp
# Opt level: O0

PhysicalDeviceDetails * add_basic_physical_device(VulkanMock *mock)

{
  VkMemoryHeapFlags *this;
  pointer this_00;
  reference pvVar1;
  uint32_t *local_eb0;
  VkMemoryType *local_e88;
  PhysicalDeviceDetails local_e80;
  undefined4 local_7e4;
  undefined4 uStack_7e0;
  undefined4 local_7dc;
  undefined1 auStack_7d8 [8];
  VkQueueFamilyProperties queue_family_properties;
  VkExtensionProperties local_7ac;
  undefined1 local_6a8 [8];
  PhysicalDeviceDetails physical_device_details;
  VulkanMock *mock_local;
  
  local_6a8._0_4_ = 0;
  local_6a8._4_4_ = 0;
  physical_device_details.properties.apiVersion = 0;
  physical_device_details.properties.driverVersion = 0;
  physical_device_details.properties.vendorID = 0;
  physical_device_details.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)mock;
  memset(&physical_device_details.properties.deviceID,0,0x100);
  memset(physical_device_details.properties.deviceName + 0xf8,0,0x10);
  memset(physical_device_details.properties.pipelineCacheUUID + 0xc,0,0x1f8);
  memset(&physical_device_details.properties.limits.nonCoherentAtomSize,0,0x14);
  physical_device_details.properties.sparseProperties.residencyNonResidentStrict = 0;
  physical_device_details.properties._820_4_ = 0;
  physical_device_details.features.robustBufferAccess = 0;
  physical_device_details.features.fullDrawIndexUint32 = 0;
  physical_device_details.features.imageCubeArray = 0;
  physical_device_details.features.independentBlend = 0;
  physical_device_details.features.geometryShader = 0;
  physical_device_details.features.tessellationShader = 0;
  physical_device_details.features.sampleRateShading = 0;
  physical_device_details.features.dualSrcBlend = 0;
  physical_device_details.features.logicOp = 0;
  physical_device_details.features.multiDrawIndirect = 0;
  physical_device_details.features.drawIndirectFirstInstance = 0;
  physical_device_details.features.depthClamp = 0;
  physical_device_details.features.depthBiasClamp = 0;
  physical_device_details.features.fillModeNonSolid = 0;
  physical_device_details.features.depthBounds = 0;
  physical_device_details.features.wideLines = 0;
  physical_device_details.features.largePoints = 0;
  physical_device_details.features.alphaToOne = 0;
  physical_device_details.features.multiViewport = 0;
  physical_device_details.features.samplerAnisotropy = 0;
  physical_device_details.features.textureCompressionETC2 = 0;
  physical_device_details.features.textureCompressionASTC_LDR = 0;
  physical_device_details.features.textureCompressionBC = 0;
  physical_device_details.features.occlusionQueryPrecise = 0;
  physical_device_details.features.pipelineStatisticsQuery = 0;
  physical_device_details.features.vertexPipelineStoresAndAtomics = 0;
  physical_device_details.features.fragmentStoresAndAtomics = 0;
  physical_device_details.features.shaderTessellationAndGeometryPointSize = 0;
  physical_device_details.features.shaderImageGatherExtended = 0;
  physical_device_details.features.shaderStorageImageExtendedFormats = 0;
  physical_device_details.features.shaderStorageImageMultisample = 0;
  physical_device_details.features.shaderStorageImageReadWithoutFormat = 0;
  physical_device_details.features.shaderStorageImageWriteWithoutFormat = 0;
  physical_device_details.features.shaderUniformBufferArrayDynamicIndexing = 0;
  physical_device_details.features.shaderSampledImageArrayDynamicIndexing = 0;
  physical_device_details.features.shaderStorageBufferArrayDynamicIndexing = 0;
  physical_device_details.features.shaderStorageImageArrayDynamicIndexing = 0;
  physical_device_details.features.shaderClipDistance = 0;
  physical_device_details.features.shaderCullDistance = 0;
  physical_device_details.features.shaderFloat64 = 0;
  physical_device_details.features.shaderInt64 = 0;
  physical_device_details.features.shaderInt16 = 0;
  physical_device_details.features.shaderResourceResidency = 0;
  physical_device_details.features.shaderResourceMinLod = 0;
  physical_device_details.features.sparseBinding = 0;
  physical_device_details.features.sparseResidencyBuffer = 0;
  physical_device_details.features.sparseResidencyImage2D = 0;
  physical_device_details.features.sparseResidencyImage3D = 0;
  physical_device_details.features.sparseResidency2Samples = 0;
  physical_device_details.features.sparseResidency4Samples = 0;
  physical_device_details.features.sparseResidency8Samples = 0;
  physical_device_details.features.sparseResidency16Samples = 0;
  physical_device_details.features.sparseResidencyAliased = 0;
  physical_device_details.features.inheritedQueries = 0;
  local_e88 = (VkMemoryType *)&physical_device_details.field_0x414;
  memset(local_e88,0,0x100);
  do {
    local_e88 = local_e88 + 1;
  } while (local_e88 != physical_device_details.memory_properties.memoryTypes + 0x1f);
  physical_device_details.memory_properties.memoryTypes[0x1f].propertyFlags = 0;
  local_eb0 = &physical_device_details.memory_properties.memoryTypes[0x1f].heapIndex;
  memset(local_eb0,0,0x100);
  do {
    local_eb0 = local_eb0 + 4;
  } while (local_eb0 != &physical_device_details.memory_properties.memoryHeaps[0xf].flags);
  this = &physical_device_details.memory_properties.memoryHeaps[0xf].flags;
  physical_device_details.memory_properties.memoryHeaps[0xf].flags = 0;
  physical_device_details.memory_properties.memoryHeaps[0xf]._12_4_ = 0;
  physical_device_details.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  physical_device_details.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)this);
  physical_device_details.extensions.
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  physical_device_details.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  physical_device_details.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
             &physical_device_details.extensions.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  physical_device_details.queue_family_properties.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  physical_device_details.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  physical_device_details.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector((vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
            *)&physical_device_details.queue_family_properties.
               super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  physical_device_details.features_pNextChain.
  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  physical_device_details.created_device_handles.
  super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  physical_device_details.created_device_handles.
  super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>::vector
            ((vector<VkDevice_T_*,_std::allocator<VkDevice_T_*>_> *)
             &physical_device_details.features_pNextChain.
              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  physical_device_details.created_device_handles.
  super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  physical_device_details.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  physical_device_details.created_device_details.
  super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>::
  vector((vector<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
          *)&physical_device_details.created_device_handles.
             super__Vector_base<VkDevice_T_*,_std::allocator<VkDevice_T_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  get_extension_properties(&local_7ac,"VK_KHR_swapchain");
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::push_back
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)this,
             &local_7ac);
  local_6a8._0_4_ = 0x400000;
  queue_family_properties.queueFlags = 0;
  auStack_7d8._0_4_ = 7;
  auStack_7d8._4_4_ = 1;
  local_7e4 = 1;
  uStack_7e0 = 1;
  local_7dc = 1;
  queue_family_properties.minImageTransferGranularity.width = 1;
  queue_family_properties.queueCount = 1;
  queue_family_properties.timestampValidBits = 1;
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::push_back
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
             &physical_device_details.extensions.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)auStack_7d8);
  this_00 = physical_device_details.created_device_details.
            super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  VulkanMock::PhysicalDeviceDetails::PhysicalDeviceDetails
            (&local_e80,(PhysicalDeviceDetails *)local_6a8);
  VulkanMock::add_physical_device((VulkanMock *)this_00,&local_e80);
  VulkanMock::PhysicalDeviceDetails::~PhysicalDeviceDetails(&local_e80);
  pvVar1 = std::
           vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
           ::back((vector<VulkanMock::PhysicalDeviceDetails,_std::allocator<VulkanMock::PhysicalDeviceDetails>_>
                   *)&((physical_device_details.created_device_details.
                        super__Vector_base<VulkanMock::CreatedDeviceDetails,_std::allocator<VulkanMock::CreatedDeviceDetails>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->features).sparseBinding
                 );
  VulkanMock::PhysicalDeviceDetails::~PhysicalDeviceDetails((PhysicalDeviceDetails *)local_6a8);
  return pvVar1;
}

Assistant:

VulkanMock::PhysicalDeviceDetails& add_basic_physical_device(VulkanMock& mock) {
    VulkanMock::PhysicalDeviceDetails physical_device_details{};
    physical_device_details.extensions.push_back(get_extension_properties(VK_KHR_SWAPCHAIN_EXTENSION_NAME));
    physical_device_details.properties.apiVersion = VK_API_VERSION_1_0;
    VkQueueFamilyProperties queue_family_properties{};
    queue_family_properties.queueCount = 1;
    queue_family_properties.queueFlags = VK_QUEUE_GRAPHICS_BIT | VK_QUEUE_COMPUTE_BIT | VK_QUEUE_TRANSFER_BIT;
    queue_family_properties.minImageTransferGranularity = { 1, 1, 1 };
    physical_device_details.queue_family_properties.push_back(queue_family_properties);
    mock.add_physical_device(std::move(physical_device_details));
    return mock.physical_devices_details.back();
}